

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

bool __thiscall hwtest::pgraph::MthdEmuD3D0Alpha::is_valid_val(MthdEmuD3D0Alpha *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  return uVar1 < 0x1000 && (uVar1 >> 8 & 0xf) - 1 < 8;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 8, 4) < 1 || extr(val, 8, 4) > 8)
			return false;
		if (extr(val, 12, 20))
			return false;
		return true;
	}